

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

ExecutionResult * __thiscall
SchemeProcedure::execute
          (ExecutionResult *__return_storage_ptr__,SchemeProcedure *this,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
          *val_list)

{
  size_type sVar1;
  eval_error *peVar2;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  *val_list_local;
  SchemeProcedure *this_local;
  
  sVar1 = std::__cxx11::
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::size
                    (val_list);
  if ((long)sVar1 < (this->arity).first) {
    peVar2 = (eval_error *)__cxa_allocate_exception(0x10);
    eval_error::runtime_error(peVar2,"Too few arguments");
    __cxa_throw(peVar2,&eval_error::typeinfo,eval_error::~eval_error);
  }
  if (-1 < (this->arity).second) {
    sVar1 = std::__cxx11::
            list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
            size(val_list);
    if ((this->arity).second < (long)sVar1) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(peVar2,"Too many arguments");
      __cxa_throw(peVar2,&eval_error::typeinfo,eval_error::~eval_error);
    }
  }
  (*(this->super_SchemeObject)._vptr_SchemeObject[7])(__return_storage_ptr__,this,val_list);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeProcedure::execute(const std::list<std::shared_ptr<SchemeObject>> &val_list) const
{
    if((long long) val_list.size() < arity.first)
        throw eval_error("Too few arguments");
    if(arity.second >= 0 && (long long) val_list.size() > arity.second)
        throw eval_error("Too many arguments");
    return _run(val_list);
}